

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<std::optional<int>_> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseEnumFromStr<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,MaybeOwnedString *str,
          Field<google::protobuf::json_internal::ParseProto3Type> field)

{
  bool bVar1;
  int *__t;
  ParseOptions *pPVar2;
  Status *v;
  anon_union_8_2_a3c22f61_for_StatusOrData<std::optional<int>_>_3 extraout_RDX;
  string_view name;
  StatusOr<std::optional<int>_> SVar3;
  optional<int> local_80;
  string_view local_78;
  int local_64 [2];
  int32_t i;
  string_view local_48;
  undefined1 local_38 [8];
  StatusOr<int> value;
  Field<google::protobuf::json_internal::ParseProto3Type> field_local;
  MaybeOwnedString *str_local;
  JsonLexer *lex_local;
  
  value.super_StatusOrData<int>._8_8_ = field;
  local_48 = MaybeOwnedString::AsView(str);
  JsonLexer::options(lex);
  name._M_str = (char *)local_48._M_len;
  name._M_len = (size_t)field;
  Proto3Type::EnumNumberByName((Field)local_38,name,local_48._M_str._0_1_);
  bVar1 = absl::lts_20240722::StatusOr<int>::ok((StatusOr<int> *)local_38);
  if (bVar1) {
    __t = absl::lts_20240722::StatusOr<int>::operator*((StatusOr<int> *)local_38);
    std::optional<int>::optional<int_&,_true>((optional<int> *)&i,__t);
    absl::lts_20240722::StatusOr<std::optional<int>_>::StatusOr<std::optional<int>,_0>
              ((StatusOr<std::optional<int>_> *)this,(optional<int> *)&i);
  }
  else {
    local_78 = MaybeOwnedString::AsView(str);
    bVar1 = absl::lts_20240722::SimpleAtoi<int>(local_78,local_64);
    if (bVar1) {
      std::optional<int>::optional<int_&,_true>(&local_80,local_64);
      absl::lts_20240722::StatusOr<std::optional<int>_>::StatusOr<std::optional<int>,_0>
                ((StatusOr<std::optional<int>_> *)this,&local_80);
    }
    else {
      pPVar2 = JsonLexer::options(lex);
      if ((pPVar2->ignore_unknown_fields & 1U) == 0) {
        v = absl::lts_20240722::StatusOr<int>::status((StatusOr<int> *)local_38);
        absl::lts_20240722::StatusOr<std::optional<int>_>::
        StatusOr<const_absl::lts_20240722::Status_&,_0>((StatusOr<std::optional<int>_> *)this,v);
      }
      else {
        absl::lts_20240722::StatusOr<std::optional<int>_>::StatusOr<const_std::nullopt_t_&,_0>
                  ((StatusOr<std::optional<int>_> *)this,(nullopt_t *)&std::nullopt);
      }
    }
  }
  local_64[1] = 1;
  absl::lts_20240722::StatusOr<int>::~StatusOr((StatusOr<int> *)local_38);
  SVar3.super_StatusOrData<std::optional<int>_>.field_1 = extraout_RDX;
  SVar3.super_StatusOrData<std::optional<int>_>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<std::optional<int>_>_1)this;
  return (StatusOr<std::optional<int>_>)SVar3.super_StatusOrData<std::optional<int>_>;
}

Assistant:

absl::StatusOr<absl::optional<int32_t>> ParseEnumFromStr(JsonLexer& lex,
                                                         MaybeOwnedString& str,
                                                         Field<Traits> field) {
  absl::StatusOr<int32_t> value = Traits::EnumNumberByName(
      field, str.AsView(), lex.options().case_insensitive_enum_parsing);
  if (value.ok()) {
    return absl::optional<int32_t>(*value);
  }

  int32_t i;
  if (absl::SimpleAtoi(str.AsView(), &i)) {
    return absl::optional<int32_t>(i);
  } else if (lex.options().ignore_unknown_fields) {
    return {absl::nullopt};
  }

  return value.status();
}